

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O1

vector<sfc::Tile,_std::allocator<sfc::Tile>_> * __thiscall
sfc::Tile::crops(vector<sfc::Tile,_std::allocator<sfc::Tile>_> *__return_storage_ptr__,Tile *this,
                uint tile_width,uint tile_height)

{
  uint x;
  uint y;
  Tile local_88;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->_height != 0) {
    y = 0;
    do {
      if (this->_width != 0) {
        x = 0;
        do {
          crop(&local_88,this,x,y,tile_width,tile_height);
          std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::emplace_back<sfc::Tile>
                    (__return_storage_ptr__,&local_88);
          if (local_88._palette.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88._palette.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88._palette.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88._palette.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_88._mirrors);
          if (local_88._data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88._data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_88._data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88._data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          x = x + tile_width;
        } while (x < this->_width);
      }
      y = y + tile_height;
    } while (y < this->_height);
  }
  return __return_storage_ptr__;
}

Assistant:

Tile Tile::crop(unsigned x, unsigned y, unsigned crop_width, unsigned crop_height) const {
  Tile t;
  t._mode = _mode;
  t._bpp = _bpp;
  t._width = crop_width;
  t._height = crop_height;
  t._palette = _palette;
  t._data.resize(crop_width * crop_height);

  if (!(x > _width || y > _height)) {
    unsigned blit_width = (x + crop_width > _width) ? _width - x : crop_width;
    unsigned blit_height = (y + crop_height > _height) ? _height - y : crop_height;
    for (unsigned iy = 0; iy < blit_height; ++iy) {
      std::memcpy(&t._data[iy * t._width], &_data[(x) + ((iy + y) * _width)], blit_width);
    }
  }

  if (_mirrors.size()) {
    t._mirrors.push_back(mirror(t._data, t._width, true, false));
    t._mirrors.push_back(mirror(t._data, t._width, false, true));
    t._mirrors.push_back(mirror(t._data, t._width, true, true));
  }

  return t;
}